

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

bool __thiscall AbstractModuleClient::unsubToTimestamps(AbstractModuleClient *this)

{
  network_pimpl *this_00;
  string local_40;
  
  this_00 = (this->super_MlmWrap).state;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  network_pimpl::setTimestamp_endpoint(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this->lastTimestamp = 0;
  if (this->timestampsub != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->timestampsub,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/AbstractModuleClient.cpp"
               ,0x222);
    std::__cxx11::string::_M_replace
              ((ulong)&this->timestampaddress,0,(char *)(this->timestampaddress)._M_string_length,
               0x360c54);
  }
  return true;
}

Assistant:

bool AbstractModuleClient::unsubToTimestamps(){
    state->setTimestamp_endpoint("");
    lastTimestamp = 0;
    if(timestampsub){
        zsock_destroy(&timestampsub);
        timestampaddress = "";
        return true;
    }
    return true;
}